

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta.cpp
# Opt level: O1

string * cpp_client::anon_unknown_7::handle_itr
                   (string *__return_storage_ptr__,Base_game *context,Delta_mergable *apply_to,
                   ConstMemberIterator *itr,Delta_mergable *owner,
                   vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *refs,vec_ref_t *vec_refs,string *owner_name)

{
  uint uVar1;
  char *pcVar2;
  size_t __n;
  _Head_base<0UL,_cpp_client::Any::holder_*,_false> _Var3;
  long *plVar4;
  __uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_> this;
  unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> uVar5;
  _Alloc_hider _Var6;
  int iVar7;
  Ch *pCVar8;
  undefined4 extraout_var;
  const_iterator cVar9;
  ostream *poVar10;
  ostream *poVar11;
  mapped_type *pmVar12;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  undefined *puVar15;
  undefined8 *puVar16;
  mapped_type *pmVar17;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer ppVar18;
  runtime_error *this_01;
  unique_ptr<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_> uVar19;
  pointer *pppVar20;
  Delta_mergable *pDVar21;
  Pointer this_02;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar22;
  pointer ppVar23;
  vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
  to_edit;
  Any key;
  int num;
  undefined4 uStack_dc;
  vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
  *local_d8;
  unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> value;
  string str;
  vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
  temp_refs;
  shared_ptr<cpp_client::Base_object> ptr;
  Delta_mergable *owner_local;
  string name;
  mapped_type *local_50;
  Pointer local_48;
  unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> local_40;
  unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_> local_38;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  
  this_02 = itr->ptr_;
  local_d8 = (vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
              *)refs;
  owner_local = owner;
  pCVar8 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(&this_02->name);
  std::__cxx11::string::string((string *)&name,pCVar8,(allocator *)&str);
  iVar7 = (*(context->super_Delta_mergable)._vptr_Delta_mergable[8])(context);
  this_00 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             *)CONCAT44(extraout_var,iVar7);
  uVar1 = (this_02->value).flags_;
  if (uVar1 == 0) {
    pmVar12 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)apply_to->variables_,&name);
    str._M_dataplus._M_p = (pointer)0x0;
    str._M_string_length = 0;
    _Var3._M_head_impl =
         (pmVar12->data_)._M_t.
         super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
         ._M_t.
         super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
         .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
    if (_Var3._M_head_impl != (holder *)0x0) {
      (*(_Var3._M_head_impl)->_vptr_holder[5])(_Var3._M_head_impl,&str);
    }
    if (str._M_string_length != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)str._M_string_length);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    pGVar22 = &this_02->value;
    if (uVar1 == 3) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&str,(Ch *)pGVar22);
      _Var6 = str._M_dataplus;
      str.field_2._M_allocated_capacity._0_4_ = 0x100005;
      str._M_dataplus._M_p = "gameObjectName";
      str._M_string_length = 0xe;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
      FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)&to_edit,pGVar22);
      ppVar18 = to_edit.
                super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      str.field_2._M_allocated_capacity._0_4_ = 0x100005;
      str._M_dataplus._M_p = "id";
      str._M_string_length = 2;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
      FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)&to_edit,pGVar22);
      if ((this_02->value).flags_ == 3) {
        pGVar22 = (this_02->value).data_.a.elements;
        pGVar13 = pGVar22 + (ulong)(this_02->value).data_.s.length * 2;
        if ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)_Var6._M_p == pGVar13) {
          if ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)ppVar18 == pGVar13) {
            if ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)to_edit.
                   super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                   ._M_impl.super__Vector_impl_data._M_start != pGVar13) {
              pCVar8 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    *)&to_edit.
                                       super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].second);
              std::__cxx11::string::string
                        ((string *)__return_storage_ptr__,pCVar8,(allocator *)&str);
              if (owner_name->_M_string_length == 0) {
                str._M_dataplus._M_p = (pointer)apply_to;
                to_edit.
                super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)std::__detail::
                              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                            *)apply_to->variables_,&name);
                std::
                vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
                ::
                emplace_back<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string_const&,std::__cxx11::string_const&>
                          (local_d8,(Delta_mergable **)&str,(Any **)&to_edit,&name,
                           __return_storage_ptr__);
              }
              goto LAB_00120454;
            }
            ptr.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)pGVar22;
            if ((this_02->value).flags_ == 3) {
              pGVar22 = pGVar22 + 1;
              do {
                pppVar20 = &to_edit.
                            super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
                if (pGVar22 + -1 ==
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)((this_02->value).data_.s.str + (ulong)(this_02->value).data_.s.length * 0x30
                       )) goto LAB_00120433;
                pCVar8 = rapidjson::
                         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         ::GetString(pGVar22 + -1);
                std::__cxx11::string::string((string *)&str,pCVar8,(allocator *)&to_edit);
                if (pGVar22->flags_ == 3) {
                  to_edit.
                  super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)CONCAT44(to_edit.
                                         super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                         0x100005);
                  to_edit.
                  super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_4195c;
                  to_edit.
                  super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xe;
                  rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)&temp_refs,pGVar22);
                  if (pGVar22->flags_ != 3) break;
                  if (temp_refs.
                      super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                      ._M_impl.super__Vector_impl_data._M_start ==
                      (pointer)((pGVar22->data_).s.str + (ulong)(pGVar22->data_).s.length * 0x30)) {
                    iVar7 = (*apply_to->_vptr_Delta_mergable[4])(apply_to,&name);
                    pDVar21 = owner_local;
                    to_edit.
                    super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)pppVar20;
                    if ((char)iVar7 == '\0') {
                      key.data_._M_t.
                      super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                      .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl =
                           (unique_ptr<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                            )(__uniq_ptr_data<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>,_true,_true>
                              )0x0;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&to_edit,name._M_dataplus._M_p,
                                 name._M_dataplus._M_p + name._M_string_length);
                      Any::Any<std::__cxx11::string>
                                ((Any *)&num,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&to_edit);
                      if (to_edit.
                          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                          ._M_impl.super__Vector_impl_data._M_start != (pointer)pppVar20) {
                        operator_delete(to_edit.
                                        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                      }
                      (*pDVar21->_vptr_Delta_mergable[3])(&to_edit,pDVar21,owner_name,&num,&key);
                      if ((long *)(to_edit.
                                   super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->first == (long *)0x0)
                      {
                        temp_refs.
                        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        temp_refs.
                        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      }
                      else {
                        (**(code **)(*(long *)(to_edit.
                                               super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->first +
                                    0x30))(&temp_refs);
                      }
                      std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::
                      ~unique_ptr((unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>
                                   *)&to_edit);
                      handle_itr((string *)&to_edit,context,
                                 (Delta_mergable *)
                                 temp_refs.
                                 super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                                 (ConstMemberIterator *)&ptr,pDVar21,
                                 (vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_d8,vec_refs,owner_name);
                      if (to_edit.
                          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                        iVar7 = (*(context->super_Delta_mergable)._vptr_Delta_mergable[8])();
                        pmVar17 = std::__detail::
                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                *)CONCAT44(extraout_var_00,iVar7),&name);
                        value._M_t.
                        super___uniq_ptr_impl<cpp_client::Any,_std::default_delete<cpp_client::Any>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cpp_client::Any_*,_std::default_delete<cpp_client::Any>_>
                        .super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl =
                             (__uniq_ptr_data<cpp_client::Any,_std::default_delete<cpp_client::Any>,_true,_true>
                              )(pmVar17->
                               super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr;
                        iVar7 = (*(context->super_Delta_mergable)._vptr_Delta_mergable[8])();
                        pmVar17 = std::__detail::
                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                *)CONCAT44(extraout_var_01,iVar7),&name);
                        local_50 = std::__detail::
                                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                 *)(((pmVar17->
                                                                                                          
                                                  super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr)->super_Delta_mergable).variables_,&str);
                        std::
                        vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
                        ::
                        emplace_back<cpp_client::Base_object*,cpp_client::Any*,std::__cxx11::string_const&,std::__cxx11::string&>
                                  (local_d8,(Base_object **)&value,&local_50,&str,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&to_edit);
                      }
                      if (to_edit.
                          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                          ._M_impl.super__Vector_impl_data._M_start !=
                          (pointer)&to_edit.
                                    super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        operator_delete(to_edit.
                                        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (temp_refs.
                          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   temp_refs.
                                   super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
                      }
                    }
                    else {
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&to_edit,str._M_dataplus._M_p,
                                 str._M_dataplus._M_p + str._M_string_length);
                      Any::Any<std::__cxx11::string>
                                (&key,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&to_edit);
                      if (to_edit.
                          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                          ._M_impl.super__Vector_impl_data._M_start != (pointer)pppVar20) {
                        operator_delete(to_edit.
                                        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                      }
                      _num = (holder *)0x0;
                      (*apply_to->_vptr_Delta_mergable[3])(&value,apply_to,&name,&key,&num);
                      puVar15 = &void::typeinfo;
                      if (*(long **)value._M_t.
                                    super___uniq_ptr_impl<cpp_client::Any,_std::default_delete<cpp_client::Any>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cpp_client::Any_*,_std::default_delete<cpp_client::Any>_>
                                    .super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl !=
                          (long *)0x0) {
                        puVar15 = (undefined *)
                                  (**(code **)(**(long **)value._M_t.
                                                                                                                    
                                                  super___uniq_ptr_impl<cpp_client::Any,_std::default_delete<cpp_client::Any>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cpp_client::Any_*,_std::default_delete<cpp_client::Any>_>
                                                  .super__Head_base<0UL,_cpp_client::Any_*,_false>.
                                                  _M_head_impl + 0x10))();
                      }
                      pcVar2 = *(char **)(puVar15 + 8);
                      if ((pcVar2 == "St10shared_ptrIN10cpp_client11Base_objectEE") ||
                         ((*pcVar2 != '*' &&
                          (iVar7 = strcmp(pcVar2,"St10shared_ptrIN10cpp_client11Base_objectEE"),
                          iVar7 == 0)))) {
                        if (*(long **)value._M_t.
                                      super___uniq_ptr_impl<cpp_client::Any,_std::default_delete<cpp_client::Any>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cpp_client::Any_*,_std::default_delete<cpp_client::Any>_>
                                      .super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl
                            == (long *)0x0) {
                          to_edit.
                          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                          to_edit.
                          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        }
                        else {
                          (**(code **)(**(long **)value._M_t.
                                                  super___uniq_ptr_impl<cpp_client::Any,_std::default_delete<cpp_client::Any>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cpp_client::Any_*,_std::default_delete<cpp_client::Any>_>
                                                  .super__Head_base<0UL,_cpp_client::Any_*,_false>.
                                                  _M_head_impl + 0x30))(&to_edit);
                        }
                        ppVar18 = to_edit.
                                  super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        if (to_edit.
                            super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     to_edit.
                                     super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish);
                        }
                        uVar5._M_t.
                        super___uniq_ptr_impl<cpp_client::Any,_std::default_delete<cpp_client::Any>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cpp_client::Any_*,_std::default_delete<cpp_client::Any>_>
                        .super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl =
                             value._M_t.
                             super___uniq_ptr_impl<cpp_client::Any,_std::default_delete<cpp_client::Any>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cpp_client::Any_*,_std::default_delete<cpp_client::Any>_>
                             .super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl;
                        if (ppVar18 == (pointer)0x0) {
                          to_edit.
                          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                          ppVar18 = (pointer)operator_new(0x28);
                          (ppVar18->second).data_._M_t.
                          super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                          .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl =
                               (holder *)0x100000001;
                          ppVar18->first = (unsigned_long)&PTR___Sp_counted_ptr_inplace_0013a478;
                          ppVar23 = ppVar18 + 1;
                          Base_object::Base_object((Base_object *)ppVar23);
                          plVar4 = *(long **)uVar5._M_t.
                                             super___uniq_ptr_impl<cpp_client::Any,_std::default_delete<cpp_client::Any>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_cpp_client::Any_*,_std::default_delete<cpp_client::Any>_>
                                             .super__Head_base<0UL,_cpp_client::Any_*,_false>.
                                             _M_head_impl;
                          to_edit.
                          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                          ._M_impl.super__Vector_impl_data._M_start = ppVar23;
                          to_edit.
                          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish = ppVar18;
                          if (plVar4 != (long *)0x0) {
                            (**(code **)(*plVar4 + 0x28))(plVar4,&to_edit);
                          }
                          if (to_edit.
                              super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                       to_edit.
                                       super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
                          }
                        }
                        if (*(long **)value._M_t.
                                      super___uniq_ptr_impl<cpp_client::Any,_std::default_delete<cpp_client::Any>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cpp_client::Any_*,_std::default_delete<cpp_client::Any>_>
                                      .super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl
                            == (long *)0x0) {
                          temp_refs.
                          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                          temp_refs.
                          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        }
                        else {
                          (**(code **)(**(long **)value._M_t.
                                                  super___uniq_ptr_impl<cpp_client::Any,_std::default_delete<cpp_client::Any>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_cpp_client::Any_*,_std::default_delete<cpp_client::Any>_>
                                                  .super__Head_base<0UL,_cpp_client::Any_*,_false>.
                                                  _M_head_impl + 0x30))(&temp_refs);
                        }
                        handle_itr((string *)&to_edit,context,
                                   (Delta_mergable *)
                                   temp_refs.
                                   super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                   (ConstMemberIterator *)&ptr,apply_to,
                                   (vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)local_d8,vec_refs,&name);
                        (*apply_to->_vptr_Delta_mergable[3])(&local_38,apply_to,&name,&key,&num);
                        std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::
                        ~unique_ptr(&local_38);
                        if (to_edit.
                            super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                          local_50 = std::__detail::
                                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     ::operator[]((
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)apply_to->variables_,&name);
                          std::
                          vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
                          ::
                          emplace_back<cpp_client::Delta_mergable*&,cpp_client::Any*,std::__cxx11::string_const&,std::__cxx11::string>
                                    (local_d8,&owner_local,&local_50,&str,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&to_edit);
                        }
                        if (to_edit.
                            super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                            ._M_impl.super__Vector_impl_data._M_start !=
                            (pointer)&to_edit.
                                      super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                          operator_delete(to_edit.
                                          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if (temp_refs.
                            super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     temp_refs.
                                     super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish);
                        }
                      }
                      else {
                        morph_any((Any *)value._M_t.
                                         super___uniq_ptr_impl<cpp_client::Any,_std::default_delete<cpp_client::Any>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cpp_client::Any_*,_std::default_delete<cpp_client::Any>_>
                                         .super__Head_base<0UL,_cpp_client::Any_*,_false>.
                                         _M_head_impl,pGVar22);
                        (*apply_to->_vptr_Delta_mergable[3])
                                  (&local_40,apply_to,&name,&key,
                                   value._M_t.
                                   super___uniq_ptr_impl<cpp_client::Any,_std::default_delete<cpp_client::Any>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cpp_client::Any_*,_std::default_delete<cpp_client::Any>_>
                                   .super__Head_base<0UL,_cpp_client::Any_*,_false>._M_head_impl);
                        std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::
                        ~unique_ptr(&local_40);
                      }
                      std::unique_ptr<cpp_client::Any,_std::default_delete<cpp_client::Any>_>::
                      ~unique_ptr(&value);
                    }
                    if (_num != (holder *)0x0) {
                      (*_num->_vptr_holder[1])();
                    }
                    if (key.data_._M_t.
                        super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                        .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl !=
                        (__uniq_ptr_data<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>,_true,_true>
                         )0x0) {
                      (**(code **)(*(long *)key.data_._M_t.
                                            super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                                            .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>
                                            ._M_head_impl + 8))();
                    }
                  }
                  else {
                    handle_itr((string *)&to_edit,context,apply_to,(ConstMemberIterator *)&ptr,
                               owner_local,
                               (vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_d8,vec_refs,owner_name);
                    if (to_edit.
                        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                      temp_refs.
                      super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)std::__detail::
                                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)owner_local->variables_,&name);
                      std::
                      vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
                      ::
                      emplace_back<cpp_client::Delta_mergable*&,cpp_client::Any*,std::__cxx11::string_const&,std::__cxx11::string>
                                (local_d8,&owner_local,(Any **)&temp_refs,&str,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&to_edit);
                    }
                    if (to_edit.
                        super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)pppVar20) {
                      operator_delete(to_edit.
                                      super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    }
                  }
                }
                else {
                  pmVar12 = std::__detail::
                            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                          *)apply_to->variables_,&str);
                  morph_any(pmVar12,pGVar22);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)str._M_dataplus._M_p != &str.field_2) {
                  operator_delete(str._M_dataplus._M_p);
                }
                ptr.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)(pGVar22 + 1);
                pGVar22 = pGVar22 + 2;
              } while ((this_02->value).flags_ == 3);
            }
          }
          else {
            pCVar8 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  *)&ppVar18[1].second);
            std::__cxx11::string::string((string *)&str,pCVar8,(allocator *)&temp_refs);
            (*(context->super_Delta_mergable)._vptr_Delta_mergable[9])(&to_edit,context,&str);
            pmVar17 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](this_00,&name);
            ppVar23 = to_edit.
                      super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            ppVar18 = to_edit.
                      super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            to_edit.
            super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            to_edit.
            super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            p_Var14 = (pmVar17->
                      super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi;
            (pmVar17->super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr = (element_type *)ppVar18;
            (pmVar17->super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppVar23;
            if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
            }
            if (to_edit.
                super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         to_edit.
                         super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)str._M_dataplus._M_p != &str.field_2) {
              operator_delete(str._M_dataplus._M_p);
            }
            if ((this_02->value).flags_ != 3) goto LAB_00120d6c;
            pGVar22 = (this_02->value).data_.a.elements;
            temp_refs.
            super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pGVar22;
            if ((this_02->value).flags_ == 3) {
              do {
                temp_refs.
                super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)pGVar22;
                if (pGVar22 ==
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)((this_02->value).data_.s.str + (ulong)(this_02->value).data_.s.length * 0x30
                       )) goto LAB_00120433;
                pmVar17 = std::__detail::
                          _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[](this_00,&name);
                handle_itr(&str,context,
                           &((pmVar17->
                             super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->super_Delta_mergable,(ConstMemberIterator *)&temp_refs,
                           apply_to,(vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_d8,vec_refs,&name);
                if (str._M_string_length != 0) {
                  pCVar8 = rapidjson::
                           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           ::GetString(pGVar22);
                  std::__cxx11::string::string((string *)&to_edit,pCVar8,(allocator *)&ptr);
                  pmVar17 = std::__detail::
                            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[](this_00,&name);
                  ptr.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       = (pmVar17->
                         super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr;
                  pmVar17 = std::__detail::
                            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cpp_client::Base_object>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[](this_00,&name);
                  key.data_._M_t.
                  super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                  .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl =
                       (unique_ptr<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                        )std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)(((pmVar17->
                                           super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr)->super_Delta_mergable).variables_,
                                      (key_type *)&to_edit);
                  std::
                  vector<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<cpp_client::Delta_mergable*,cpp_client::Any*,std::__cxx11::string,std::__cxx11::string>>>
                  ::
                  emplace_back<cpp_client::Base_object*,cpp_client::Any*,std::__cxx11::string&,std::__cxx11::string&>
                            (local_d8,(Base_object **)&ptr,(Any **)&key,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &to_edit,&str);
                  if (to_edit.
                      super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      (pointer)&to_edit.
                                super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    operator_delete(to_edit.
                                    super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)str._M_dataplus._M_p != &str.field_2) {
                  operator_delete(str._M_dataplus._M_p);
                }
                pGVar22 = pGVar22 + 2;
                temp_refs.
                super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)pGVar22;
              } while ((this_02->value).flags_ == 3);
            }
          }
        }
        else {
          if ((_Var6._M_p[0x29] & 4U) == 0) {
            __assert_fail("flags_ & kIntFlag",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/siggame[P]Joueur/joueur/libraries/rapidjson/include/rapidjson/document.h"
                          ,0x594,
                          "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
          (**apply_to->_vptr_Delta_mergable)(apply_to,&name,(long)*(int *)(_Var6._M_p + 0x18));
          to_edit.
          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          to_edit.
          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          to_edit.
          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          temp_refs.
          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          temp_refs.
          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          temp_refs.
          super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          if ((this_02->value).flags_ != 3) {
LAB_00120d6c:
            __assert_fail("IsObject()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/siggame[P]Joueur/joueur/libraries/rapidjson/include/rapidjson/document.h"
                          ,0x35e,
                          "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberBegin() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
          key.data_._M_t.
          super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
          ._M_t.
          super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
          .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl =
               (unique_ptr<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>)
               (this_02->value).data_.o.members;
          if ((this_02->value).flags_ == 3) {
            this._M_t.
            super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
            .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl =
                 (tuple<cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>)
                 (tuple<cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>)
                 key.data_._M_t.
                 super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                 .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
            local_48 = this_02;
            do {
              uVar19._M_t.
              super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
              ._M_t.
              super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
              .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl =
                   (__uniq_ptr_data<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>,_true,_true>
                    )((long)this._M_t.
                            super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                            .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl +
                     0x30);
              key.data_._M_t.
              super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
              ._M_t.
              super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
              .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl =
                   (unique_ptr<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                    )(unique_ptr<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                      )this._M_t.
                       super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                       .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
              if (this._M_t.
                  super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                  .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl ==
                  (tuple<cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>)
                  ((ulong)(this_02->value).data_.s.length * 0x30 +
                  (long)(this_02->value).data_.s.str)) {
                (*apply_to->_vptr_Delta_mergable[1])(apply_to,&name,&to_edit);
                if (temp_refs.
                    super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    temp_refs.
                    super__Vector_base<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  str._M_dataplus._M_p = (pointer)apply_to;
                  std::
                  vector<std::tuple<cpp_client::Base_object*,std::__cxx11::string,std::vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>>,std::allocator<std::tuple<cpp_client::Base_object*,std::__cxx11::string,std::vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>>>>
                  ::
                  emplace_back<cpp_client::Base_object*,std::__cxx11::string_const&,std::vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>>
                            ((vector<std::tuple<cpp_client::Base_object*,std::__cxx11::string,std::vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>>,std::allocator<std::tuple<cpp_client::Base_object*,std::__cxx11::string,std::vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>>>>
                              *)vec_refs,(Base_object **)&str,&name,&temp_refs);
                }
                std::
                vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                ::~vector(&temp_refs);
                std::
                vector<std::pair<unsigned_long,_cpp_client::Any>,_std::allocator<std::pair<unsigned_long,_cpp_client::Any>_>_>
                ::~vector(&to_edit);
                goto LAB_00120433;
              }
              if (this._M_t.
                  super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                  .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl !=
                  (tuple<cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>)
                  _Var6._M_p) {
                if (*(uint *)((long)this._M_t.
                                    super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                                    .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>.
                                    _M_head_impl + 0x28) == 3) {
                  ptr.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       = (element_type *)0x0;
                  p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
                  p_Var14->_M_use_count = 1;
                  p_Var14->_M_weak_count = 1;
                  p_Var14->_vptr__Sp_counted_base =
                       (_func_int **)&PTR___Sp_counted_ptr_inplace_0013a478;
                  pDVar21 = (Delta_mergable *)(p_Var14 + 1);
                  Base_object::Base_object((Base_object *)pDVar21);
                  ptr.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       = (element_type *)pDVar21;
                  ptr.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = p_Var14;
                  handle_itr(&str,context,pDVar21,(ConstMemberIterator *)&key,apply_to,
                             (vector<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<cpp_client::Delta_mergable_*,_cpp_client::Any_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_d8,vec_refs,&name);
                  pCVar8 = rapidjson::
                           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                        *)this._M_t.
                                          super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                                          .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>.
                                          _M_head_impl);
                  iVar7 = atoi(pCVar8);
                  num = iVar7;
                  if (str._M_string_length == 0) {
                    std::
                    vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
                    ::emplace_back<int_const&,std::shared_ptr<cpp_client::Base_object>>
                              ((vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
                                *)&to_edit,&num,&ptr);
                  }
                  else {
                    std::
                    vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
                    ::emplace_back<int_const&,std::__cxx11::string>
                              ((vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
                                *)&temp_refs,&num,&str);
                  }
                  this_02 = local_48;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)str._M_dataplus._M_p != &str.field_2) {
                    operator_delete(str._M_dataplus._M_p);
                  }
                  if (ptr.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (ptr.
                               super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
                  }
                }
                else {
                  str._M_dataplus._M_p = (pointer)0x0;
                  morph_any((Any *)&str,
                            (Value *)((long)this._M_t.
                                            super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                                            .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>
                                            ._M_head_impl + 0x18));
                  puVar15 = &void::typeinfo;
                  if (str._M_dataplus._M_p != (pointer)0x0) {
                    puVar15 = (undefined *)(**(code **)(*(long *)str._M_dataplus._M_p + 0x10))();
                  }
                  pcVar2 = *(char **)(puVar15 + 8);
                  if ((pcVar2 == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") ||
                     ((*pcVar2 != '*' &&
                      (iVar7 = strcmp(pcVar2,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE")
                      , iVar7 == 0)))) {
                    puVar16 = (undefined8 *)(**(code **)(*(long *)str._M_dataplus._M_p + 0x18))();
                    __n = puVar16[1];
                    if ((__n != (context->remove_string_)._M_string_length) ||
                       ((__n != 0 &&
                        (iVar7 = bcmp((void *)*puVar16,(context->remove_string_)._M_dataplus._M_p,
                                      __n), iVar7 != 0)))) goto LAB_001202e4;
                  }
                  else {
LAB_001202e4:
                    pCVar8 = rapidjson::
                             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                          *)this._M_t.
                                            super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                                            .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>
                                            ._M_head_impl);
                    iVar7 = atoi(pCVar8);
                    ptr.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)
                             CONCAT44(ptr.
                                      super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr._4_4_,iVar7);
                    std::
                    vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
                    ::emplace_back<int,cpp_client::Any>
                              ((vector<std::pair<unsigned_long,cpp_client::Any>,std::allocator<std::pair<unsigned_long,cpp_client::Any>>>
                                *)&to_edit,(int *)&ptr,(Any *)&str);
                  }
                  if (str._M_dataplus._M_p != (pointer)0x0) {
                    (**(code **)(*(long *)str._M_dataplus._M_p + 8))();
                  }
                }
              }
              this._M_t.
              super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
              .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl =
                   (tuple<cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>)
                   (tuple<cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>)
                   uVar19._M_t.
                   super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                   .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
              key.data_._M_t.
              super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
              ._M_t.
              super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
              .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl =
                   (unique_ptr<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                    )(unique_ptr<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                      )uVar19._M_t.
                       super___uniq_ptr_impl<cpp_client::Any::holder,_std::default_delete<cpp_client::Any::holder>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cpp_client::Any::holder_*,_std::default_delete<cpp_client::Any::holder>_>
                       .super__Head_base<0UL,_cpp_client::Any::holder_*,_false>._M_head_impl;
            } while ((this_02->value).flags_ == 3);
          }
        }
      }
      __assert_fail("IsObject()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/siggame[P]Joueur/joueur/libraries/rapidjson/include/rapidjson/document.h"
                    ,0x361,
                    "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberEnd() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
    if (uVar1 == 4) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"Received a JSON array in a delta.");
      *(undefined ***)this_01 = &PTR__runtime_error_0013a0d8;
      __cxa_throw(this_01,&Bad_response::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((uVar1 >> 0x14 & 1) != 0) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GetString(pGVar22);
      iVar7 = std::__cxx11::string::compare((char *)&context->remove_string_);
      if (iVar7 == 0) {
        Delta_mergable::erase(owner_local,&name);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
        goto LAB_00120454;
      }
    }
    cVar9 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&apply_to->variables_->_M_h,&name);
    if ((cVar9.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_true>
         ._M_cur == (__node_type *)0x0) &&
       (iVar7 = std::__cxx11::string::compare((char *)&name), iVar7 != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[",2);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x21);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"m",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Warning: Unknown variable ",0x1a);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,name._M_dataplus._M_p,name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," added.",7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\x1b[",2);
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"m",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    }
    pmVar12 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cpp_client::Any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)apply_to->variables_,&name);
    morph_any(pmVar12,pGVar22);
LAB_00120433:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
LAB_00120454:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name._M_dataplus._M_p != &name.field_2) {
    operator_delete(name._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string
   handle_itr(Base_game& context,
              Delta_mergable& apply_to,
              const rapidjson::Value::ConstMemberIterator& itr,
              Delta_mergable* owner,
              std::vector<std::tuple<Delta_mergable*, Any*, std::string, std::string>>& refs,
              vec_ref_t& vec_refs,
              const std::string& owner_name)
{
   const auto& val = itr->value;
   const auto name = std::string(itr->name.GetString());
   auto& objects = context.get_objects();
   //check if it's an object
   if(val.IsObject())
   {
      //check if it's an "array"
      auto len_itr = val.FindMember(context.len_string().c_str());
      auto type_itr = val.FindMember("gameObjectName");
      auto id_itr = val.FindMember("id");
      if(len_itr != val.MemberEnd())
      {
         //array...
         //grab the length
         auto size = attr_wrapper::as<int>(len_itr->value);
         //resize the vector
         apply_to.resize(name, size);
         std::vector<std::pair<std::size_t, Any>> to_edit;
         std::vector<std::pair<std::size_t, Any>> temp_refs;
         for(auto data_iter = val.MemberBegin(); data_iter != val.MemberEnd(); ++data_iter)
         {
            //skip the length iterator
            if(data_iter == len_itr)
            {
               continue;
            }
            //either a game object or a primitive - if it's an object it's a game object
            if(data_iter->value.IsObject())
            {
               //make a base object and then edit it
               auto ptr = std::make_shared<Base_object>();
               auto str = handle_itr(context,
                                     *ptr,
                                     data_iter,
                                     &apply_to,
                                     refs,
                                     vec_refs,
                                     name);
               const auto num = atoi(data_iter->name.GetString());
               if(!str.empty())
               {
                  temp_refs.emplace_back(num, std::move(str));
               }
               else
               {
                  to_edit.emplace_back(num, std::move(ptr));
               }
            }
            else
            {
               Any to_add;
               morph_any(to_add, data_iter->value);
               bool add = true;
               //if it's the remove state remove ignore it
               if(to_add.type() == typeid(std::string))
               {
                  add = (to_add.as<std::string>() != context.remove_string());
               }
               if(add)
               {
                  to_edit.emplace_back(atoi(data_iter->name.GetString()),
                                       std::move(to_add));
               }
            }
         }
         apply_to.change_vec_values(name, to_edit);
         //put vector object references in there too (if non-empty)
         if(!temp_refs.empty())
         {
            vec_refs.emplace_back(static_cast<Base_object*>(&apply_to),
                                  name,
                                  std::move(temp_refs));
         }
      }
      else if(type_itr != val.MemberEnd())
      {
         //new object...
         //give it a place in the objects
         objects[name] = context.generate_object(attr_wrapper::as<std::string>(type_itr->value));
         for(auto data_iter = val.MemberBegin(); data_iter != val.MemberEnd(); ++data_iter)
         {
            auto str = handle_itr(context,
                                  *objects[name],
                                  data_iter,
                                  &apply_to,
                                  refs,
                                  vec_refs,
                                  name);
            if(!str.empty())
            {
               auto target = std::string{data_iter->name.GetString()};
               refs.emplace_back(objects[name].get(),
                                 &objects[name]->variables_[target],
                                 target,
                                 str);
            }
         }
      }
      else if(id_itr != val.MemberEnd())
      {
         const auto ref = attr_wrapper::as<std::string>(id_itr->value);
         if(owner_name.empty())
         {
            //object reference...
            refs.emplace_back(&apply_to,
                              &apply_to.variables_[name],
                              name,
                              ref);
         }
         return ref;
      }
      else
      {
         //map...
         for(auto data_iter = val.MemberBegin(); data_iter != val.MemberEnd(); ++data_iter)
         {
            const auto target = std::string{data_iter->name.GetString()};
            if(data_iter->value.IsObject())
            {
               //see if it is a new object
               const auto name_iter = data_iter->value.FindMember("gameObjectName");
               if(name_iter != data_iter->value.MemberEnd())
               {
                  auto str = handle_itr(context,
                                        apply_to,
                                        data_iter,
                                        owner,
                                        refs,
                                        vec_refs,
                                        owner_name);
                  if(!str.empty())
                  {
                     refs.emplace_back(owner,
                                       &owner->variables_[name],
                                       target,
                                       std::move(str));
                  }
               }
               else if(!apply_to.is_map(name))
               {
                  auto owner2 = static_cast<Base_object*>(owner);
                  Any dummy;
                  Any key = std::string{name};
                  auto self = owner2->add_key_value(owner_name, key, dummy)->get();
                  auto str = handle_itr(context,
                                        *self,
                                        data_iter,
                                        owner2,
                                        refs,
                                        vec_refs,
                                        owner_name);
                  if(!str.empty())
                  {
                     // str is the id of the object to bind to
                     // target is the field name
                     // name is the id of the object to manipulate
                     refs.emplace_back(context.get_objects()[name].get(),
                                       &context.get_objects()[name]->variables_[target],
                                       target,
                                       str);
                  }
               }
               else
               {
                  //need to handle object references
                  Any key{std::string{target}};
                  Any dummy{};
                  auto value = apply_to.add_key_value(name, key, dummy);
                  if(value->type() == typeid(std::shared_ptr<Base_object>))
                  {
                     //make an object if needed
                     if(!value->get())
                     {
                        value->reset(std::make_shared<Base_object>());
                     }
                     auto self = value->get();
                     auto str = handle_itr(context,
                                           *self,
                                           data_iter,
                                           &apply_to,
                                           refs,
                                           vec_refs,
                                           name);
                     apply_to.add_key_value(name, key, dummy);
                     if(!str.empty())
                     {
                        refs.emplace_back(owner,
                                          &apply_to.variables_[name],
                                          target,
                                          std::move(str));
                     }
                  }
                  else
                  {
                     //otherwise just morph it
                     morph_any(*value, data_iter->value);
                     apply_to.add_key_value(name, key, *value);
                  }
               }
            }
            else
            {
               morph_any(apply_to.variables_[target], data_iter->value);
            }
         }
      }
   }
   else if(!val.IsArray())
   {
      if(val.IsNull())
      {
         apply_to.variables_[name].reset();
         return "";
      }
      else if(val.IsString() && val.GetString() == context.remove_string())
      {
         //remove this thing
         owner->erase(name);
         return "";
      }
      //do some checking (ignore name because of game weirdness)
      if(!apply_to.variables_.count(name) && name != "name")
      {
         std::cout << sgr::text_yellow
                   << "Warning: Unknown variable " << name << " added." << sgr::reset
                   << "\n"
                   ;
      }
      morph_any(apply_to.variables_[name], val);
   }
   else
   {
      //array - some kind of error
      throw Bad_response("Received a JSON array in a delta.");
   }
   return "";
}